

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_constraint.cpp
# Opt level: O0

void __thiscall
Animation_Constraint::Init_Target_Value(Animation_Constraint *this,Am_Slot *new_slot)

{
  bool bVar1;
  uint uVar2;
  Am_Value *pAVar3;
  Am_Wrapper *in_value;
  Am_Value *local_118;
  Am_Value *local_d8;
  Am_Slot local_88;
  Am_Slot local_80;
  Am_Slot local_78;
  undefined1 local_70 [8];
  Am_Value_List targets;
  undefined1 local_58 [8];
  Am_Value_List slots;
  Am_Slot_Key new_key;
  Am_Slot_Key key;
  Am_Object_Advanced obj;
  Am_Object local_28;
  Am_Object local_20;
  Am_Object owner;
  Am_Slot *new_slot_local;
  Animation_Constraint *this_local;
  
  if ((this->must_initialize_instance & 1U) == 0) {
    owner.data = (Am_Object_Data *)new_slot;
    Am_Slot::Get_Owner((Am_Slot *)&local_28);
    Am_Object::Am_Object(&local_20,&local_28);
    Am_Object_Advanced::~Am_Object_Advanced((Am_Object_Advanced *)&local_28);
    Am_Object_Advanced::Am_Object_Advanced
              ((Am_Object_Advanced *)&stack0xffffffffffffffc0,(Am_Object_Advanced *)&local_20);
    slots.item._4_2_ = Am_Slot::Get_Key((Am_Slot *)owner.data);
    if ((this->multi_slot & 1U) == 0) {
      local_80 = Am_Object_Advanced::Get_Slot(&this->interpolator,0xeb);
      pAVar3 = Am_Slot::Get(&local_80);
      uVar2 = Am_Value::operator_cast_to_int(pAVar3);
      slots.item._6_2_ = (Am_Slot_Key)uVar2;
      if ((uVar2 & 0xffff) == (uint)slots.item._4_2_) {
        local_118 = Am_Slot::Get((Am_Slot *)owner.data);
      }
      else {
        local_88 = Am_Object_Advanced::Get_Slot
                             ((Am_Object_Advanced *)&stack0xffffffffffffffc0,slots.item._6_2_);
        local_118 = Am_Slot::Get(&local_88);
      }
      Am_Value::operator=(&this->target,local_118);
    }
    else {
      targets.item = (Am_List_Item *)Am_Object_Advanced::Get_Slot(&this->interpolator,0xeb);
      pAVar3 = Am_Slot::Get((Am_Slot *)&targets.item);
      Am_Value_List::Am_Value_List((Am_Value_List *)local_58,pAVar3);
      Am_Value_List::Am_Value_List((Am_Value_List *)local_70);
      Am_Value_List::Start((Am_Value_List *)local_58);
      while (bVar1 = Am_Value_List::Last((Am_Value_List *)local_58), ((bVar1 ^ 0xffU) & 1) != 0) {
        pAVar3 = Am_Value_List::Get((Am_Value_List *)local_58);
        uVar2 = Am_Value::operator_cast_to_int(pAVar3);
        slots.item._6_2_ = (Am_Slot_Key)uVar2;
        if ((uVar2 & 0xffff) == (uint)slots.item._4_2_) {
          local_d8 = Am_Slot::Get((Am_Slot *)owner.data);
        }
        else {
          local_78 = Am_Object_Advanced::Get_Slot
                               ((Am_Object_Advanced *)&stack0xffffffffffffffc0,slots.item._6_2_);
          local_d8 = Am_Slot::Get(&local_78);
        }
        Am_Value_List::Add((Am_Value_List *)local_70,local_d8,Am_TAIL,true);
        Am_Value_List::Next((Am_Value_List *)local_58);
      }
      in_value = Am_Value_List::operator_cast_to_Am_Wrapper_((Am_Value_List *)local_70);
      Am_Value::operator=(&this->target,in_value);
      Am_Value_List::~Am_Value_List((Am_Value_List *)local_70);
      Am_Value_List::~Am_Value_List((Am_Value_List *)local_58);
    }
    Am_Object_Advanced::~Am_Object_Advanced((Am_Object_Advanced *)&stack0xffffffffffffffc0);
    Am_Object::~Am_Object(&local_20);
  }
  return;
}

Assistant:

void
Animation_Constraint::Init_Target_Value(const Am_Slot &new_slot)
{
  if (must_initialize_instance)
    return;

  Am_Object owner = primary_slot.Get_Owner();
  Am_Object_Advanced obj = (Am_Object_Advanced &)owner;
  Am_Slot_Key key;
  Am_Slot_Key new_key = new_slot.Get_Key();

  if (multi_slot) {
    Am_Value_List slots = interpolator.Get_Slot(Am_SLOT_TO_ANIMATE).Get();
    Am_Value_List targets;

    for (slots.Start(); !slots.Last(); slots.Next()) {
      key = (int)slots.Get();
      targets.Add((key == new_key) ? new_slot.Get() : obj.Get_Slot(key).Get());
    }

    target = targets;
  } else {
    key = (int)interpolator.Get_Slot(Am_SLOT_TO_ANIMATE).Get();
    target = (key == new_key) ? new_slot.Get() : obj.Get_Slot(key).Get();
  }
}